

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O3

void complex_sen(treeNode *tn)

{
  vector<treeNode_*,_std::allocator<treeNode_*>_> *this;
  pointer *ppptVar1;
  iterator iVar2;
  int iVar3;
  treeNode *ptVar4;
  treeNode *ptVar5;
  undefined8 extraout_RAX;
  treeNode *sen_BLOCKts;
  treeNode *sen_BLOCKt;
  treeNode *local_100 [2];
  undefined1 local_f0 [32];
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
  if (iVar3 == 0) {
    ptVar4 = (treeNode *)operator_new(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"begin","");
    treeNode::treeNode(ptVar4,&local_50);
    this = &tn->child;
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_100[0] = ptVar4;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*>
                ((vector<treeNode*,std::allocator<treeNode*>> *)this,iVar2,local_100);
    }
    else {
      *iVar2._M_current = ptVar4;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    GETSYM_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&sym_abi_cxx11_,(string *)local_100);
    if (local_100[0] != (treeNode *)local_f0) {
      operator_delete(local_100[0],(ulong)(local_f0._0_8_ + 1));
    }
    ptVar4 = (treeNode *)operator_new(0x38);
    local_70._M_allocated_capacity = (size_type)&local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,anon_var_dwarf_7d4c + 6,anon_var_dwarf_7d4c + 0xc);
    treeNode::treeNode(ptVar4,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_allocated_capacity != &local_60) {
      operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1);
    }
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_f0._16_8_ = this;
    local_f0._24_8_ = ptVar4;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                ((vector<treeNode*,std::allocator<treeNode*>> *)this,iVar2,
                 (treeNode **)(local_f0 + 0x18));
    }
    else {
      *iVar2._M_current = ptVar4;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    sen_BLOCK((treeNode *)local_f0._24_8_);
    iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
    if (iVar3 == 0) {
      ptVar4 = (treeNode *)(local_90 + 0x10);
      do {
        ptVar5 = (treeNode *)operator_new(0x38);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,";","");
        treeNode::treeNode(ptVar5,&local_d0);
        iVar2._M_current =
             (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_100[0] = ptVar5;
        if (iVar2._M_current ==
            (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*>
                    ((vector<treeNode*,std::allocator<treeNode*>> *)local_f0._16_8_,iVar2,local_100)
          ;
        }
        else {
          *iVar2._M_current = ptVar5;
          ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *ppptVar1 = *ppptVar1 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        GETSYM_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&sym_abi_cxx11_,(string *)local_100);
        if (local_100[0] != (treeNode *)local_f0) {
          operator_delete(local_100[0],(ulong)(local_f0._0_8_ + 1));
        }
        ptVar5 = (treeNode *)operator_new(0x38);
        local_90._0_8_ = ptVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,anon_var_dwarf_7d4c + 6,anon_var_dwarf_7d4c + 0xc);
        treeNode::treeNode(ptVar5,(string *)local_90);
        if ((treeNode *)local_90._0_8_ != ptVar4) {
          operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        }
        iVar2._M_current =
             (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_100[0] = ptVar5;
        if (iVar2._M_current ==
            (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*const&>
                    ((vector<treeNode*,std::allocator<treeNode*>> *)local_f0._16_8_,iVar2,local_100)
          ;
        }
        else {
          *iVar2._M_current = ptVar5;
          ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *ppptVar1 = *ppptVar1 + 1;
        }
        sen_BLOCK(local_100[0]);
        iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
      } while (iVar3 == 0);
    }
    iVar3 = std::__cxx11::string::compare((char *)&sym_abi_cxx11_);
    if (iVar3 != 0) {
      error_exc(0x10);
      operator_delete(ptVar4,0x38);
      _Unwind_Resume(extraout_RAX);
    }
    ptVar4 = (treeNode *)operator_new(0x38);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"end","");
    treeNode::treeNode(ptVar4,&local_b0);
    iVar2._M_current =
         (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_100[0] = ptVar4;
    if (iVar2._M_current ==
        (tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<treeNode*,std::allocator<treeNode*>>::_M_realloc_insert<treeNode*>
                ((vector<treeNode*,std::allocator<treeNode*>> *)local_f0._16_8_,iVar2,local_100);
    }
    else {
      *iVar2._M_current = ptVar4;
      ppptVar1 = &(tn->child).super__Vector_base<treeNode_*,_std::allocator<treeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *ppptVar1 = *ppptVar1 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    GETSYM_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&sym_abi_cxx11_,(string *)local_100);
    if (local_100[0] != (treeNode *)local_f0) {
      operator_delete(local_100[0],(ulong)(local_f0._0_8_ + 1));
    }
  }
  return;
}

Assistant:

void complex_sen(treeNode* tn)
{
    if (sym == "begin") {
        tn->child.push_back(new treeNode("begin"));
        sym = GETSYM();
        auto *sen_BLOCKt = new treeNode("语句");
        tn->child.push_back(sen_BLOCKt);
        sen_BLOCK(sen_BLOCKt);
        while (sym == ";") {
            tn->child.push_back(new treeNode(";"));
            sym = GETSYM();
            auto *sen_BLOCKts = new treeNode("语句");
            tn->child.push_back(sen_BLOCKts);
            sen_BLOCK(sen_BLOCKts);
        }
        if (sym == "end") {
            tn->child.push_back(new treeNode("end"));
            sym = GETSYM();
        }
        else error_exc(complex_end_wrong);           //不是正确的复合语句结束
    } else return;
}